

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O2

int enet_protocol_send_outgoing_commands(ENetHost *host,ENetEvent *event,int checkForTimeouts)

{
  uint32_t *puVar1;
  byte *pbVar2;
  ENetList *pEVar3;
  ENetList *pEVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  ushort uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint uVar10;
  uint32_t uVar11;
  ENetPeerState EVar12;
  _ENetListNode *p_Var13;
  _ENetListNode *p_Var14;
  ENetChecksumCallback p_Var15;
  ENetPacket *packet;
  ushort uVar16;
  int iVar17;
  ENetPeer *pEVar18;
  uint64_t uVar19;
  uint uVar20;
  _ENetListNode *p_Var21;
  long lVar22;
  uint uVar23;
  _ENetListNode *p_Var24;
  uint uVar25;
  ulong uVar26;
  size_t sVar27;
  ENetPeer *peer;
  uint8_t headerData [12];
  
  host->continueSending = 1;
  iVar17 = 1;
  do {
    if (iVar17 == 0) {
      return 0;
    }
    host->continueSending = 0;
    pEVar18 = host->peers;
    for (peer = pEVar18; peer < pEVar18 + host->peerCount; peer = peer + 1) {
      if ((peer->state != ENET_PEER_STATE_DISCONNECTED) && (peer->state != ENET_PEER_STATE_ZOMBIE))
      {
        host->headerFlags = 0;
        host->commandCount = 0;
        host->bufferCount = 1;
        host->packetSize = (ulong)(host->checksumCallback != (ENetChecksumCallback)0x0) * 8 + 4;
        p_Var24 = (peer->acknowledgements).sentinel.next;
        if (p_Var24 != &(peer->acknowledgements).sentinel) {
          uVar26 = 0x8c;
          lVar22 = 0x6a8;
          while (p_Var24 != &(peer->acknowledgements).sentinel) {
            if (0x68b < uVar26) {
              uVar26 = 0x68c;
              lVar22 = 0x8a8;
LAB_0010393e:
              host->continueSending = 1;
              break;
            }
            sVar27 = host->packetSize;
            if (peer->mtu - sVar27 < 8) goto LAB_0010393e;
            p_Var13 = p_Var24->next;
            *(ulong *)((long)&host->socket + lVar22) = (long)&host->socket + uVar26;
            *(undefined8 *)((long)&(host->address).field_0 + lVar22 + 4) = 8;
            host->packetSize = sVar27 + 8;
            uVar16 = *(ushort *)((long)&p_Var24[1].next + 6);
            uVar16 = uVar16 << 8 | uVar16 >> 8;
            *(undefined1 *)((long)&host->socket + uVar26) = 1;
            *(undefined1 *)((long)&host->socket + uVar26 + 1) =
                 *(undefined1 *)((long)&p_Var24[1].next + 5);
            *(ushort *)((long)&host->socket + uVar26 + 2) = uVar16;
            *(ushort *)((long)&(host->address).field_0 + uVar26) = uVar16;
            *(ushort *)((long)&(host->address).field_0 + uVar26 + 2) =
                 *(ushort *)&p_Var24[1].next << 8 | *(ushort *)&p_Var24[1].next >> 8;
            if (((ulong)p_Var24[1].next & 0xf00000000) == 0x400000000) {
              enet_protocol_dispatch_state(host,peer,ENET_PEER_STATE_ZOMBIE);
            }
            p_Var21 = p_Var24->next;
            p_Var14 = p_Var24->previous;
            p_Var14->next = p_Var21;
            p_Var21->previous = p_Var14;
            (*(code *)callbacks_1)(p_Var24);
            uVar26 = uVar26 + 0x30;
            lVar22 = lVar22 + 0x10;
            p_Var24 = p_Var13;
          }
          uVar25 = (int)uVar26 - 0x8c;
          host->commandCount =
               (long)(short)((int)((uint)(ushort)((short)uVar25 >> 0xf) << 0x10 | uVar25 & 0xffff) /
                            0x30);
          host->bufferCount = lVar22 + -0x698 >> 4;
        }
        if (checkForTimeouts != 0) {
          pEVar3 = &peer->sentReliableCommands;
          p_Var24 = (peer->sentReliableCommands).sentinel.next;
          if ((p_Var24 != &pEVar3->sentinel) &&
             (uVar8 = host->serviceTime, uVar8 - peer->nextTimeout < 86400000)) {
            p_Var13 = (peer->outgoingCommands).sentinel.next;
            while (p_Var21 = p_Var24, p_Var21 != &pEVar3->sentinel) {
              p_Var24 = p_Var21->next;
              uVar9 = *(uint32_t *)((long)&p_Var21[1].next + 4);
              uVar23 = uVar8 - uVar9;
              uVar20 = uVar9 - uVar8;
              uVar25 = uVar23;
              if (86399999 < uVar23) {
                uVar25 = uVar20;
              }
              uVar10 = *(uint *)&p_Var21[1].previous;
              if (uVar10 <= uVar25) {
                uVar11 = peer->earliestTimeout;
                if ((uVar11 == 0) || (86399999 < uVar9 - uVar11)) {
                  peer->earliestTimeout = uVar9;
                  if (uVar9 != 0) goto LAB_00103b24;
                }
                else {
                  uVar23 = uVar8 - uVar11;
                  uVar20 = uVar11 - uVar8;
LAB_00103b24:
                  if (uVar23 < 86400000) {
                    uVar20 = uVar23;
                  }
                  if ((peer->timeoutMaximum <= uVar20) ||
                     ((*(uint *)((long)&p_Var21[1].previous + 4) <= uVar10 &&
                      (peer->timeoutMinimum <= uVar20)))) {
                    EVar12 = peer->state;
                    if (ENET_PEER_STATE_ACKNOWLEDGING_CONNECT < EVar12) {
                      host->recalculateBandwidthLimits = 1;
                    }
                    if (EVar12 == ENET_PEER_STATE_CONNECTING ||
                        ENET_PEER_STATE_CONNECTION_PENDING < EVar12) {
                      if (event == (ENetEvent *)0x0) {
                        peer->eventData = 0;
                        enet_protocol_dispatch_state(host,peer,ENET_PEER_STATE_ZOMBIE);
                        goto LAB_00103cd3;
                      }
                      event->type = ENET_EVENT_TYPE_DISCONNECT_TIMEOUT;
                      event->peer = peer;
                      event->data = 0;
                      enet_peer_reset(peer);
                    }
                    else {
                      enet_peer_reset(peer);
                      if (event == (ENetEvent *)0x0) goto LAB_00103cd3;
                    }
                    if (event->type != ENET_EVENT_TYPE_NONE) {
                      return 1;
                    }
                    goto LAB_00103cd3;
                  }
                }
                if (p_Var21[5].previous != (_ENetListNode *)0x0) {
                  peer->reliableDataInTransit =
                       peer->reliableDataInTransit - (uint)*(ushort *)((long)&p_Var21[2].next + 4);
                }
                peer->totalPacketsLost = peer->totalPacketsLost + 1;
                iVar17 = peer->roundTripTimeVariance * 4 + peer->roundTripTime;
                *(int *)&p_Var21[1].previous = iVar17;
                *(uint32_t *)((long)&p_Var21[1].previous + 4) = iVar17 * peer->timeoutLimit;
                p_Var14 = p_Var21->previous;
                p_Var14->next = p_Var24;
                p_Var24->previous = p_Var14;
                p_Var14 = p_Var13->previous;
                p_Var21->previous = p_Var14;
                p_Var21->next = p_Var13;
                p_Var14->next = p_Var21;
                p_Var13->previous = p_Var21;
                p_Var21 = (peer->sentReliableCommands).sentinel.next;
                if (p_Var21 != &pEVar3->sentinel && p_Var24 == p_Var21) {
                  peer->nextTimeout =
                       *(int *)&p_Var24[1].previous + *(int *)((long)&p_Var24[1].next + 4);
                }
              }
            }
          }
        }
        pEVar3 = &peer->outgoingCommands;
        if ((((peer->outgoingCommands).sentinel.next == &pEVar3->sentinel) ||
            (iVar17 = enet_protocol_check_outgoing_commands(host,peer), iVar17 != 0)) &&
           ((peer->sentReliableCommands).sentinel.next == &(peer->sentReliableCommands).sentinel)) {
          uVar20 = host->serviceTime - peer->lastReceiveTime;
          uVar25 = peer->lastReceiveTime - host->serviceTime;
          if (uVar20 < 86400000) {
            uVar25 = uVar20;
          }
          if ((peer->pingInterval <= uVar25) && (3 < (ulong)peer->mtu - host->packetSize)) {
            enet_peer_ping(peer);
            enet_protocol_check_outgoing_commands(host,peer);
          }
        }
        if (host->commandCount != 0) {
          host->buffers[0].data = headerData;
          uVar16 = (ushort)*(uint *)&host->headerFlags;
          sVar27 = 2;
          if ((*(uint *)&host->headerFlags >> 0xe & 1) != 0) {
            uVar7 = (ushort)host->serviceTime;
            headerData._2_2_ = uVar7 << 8 | uVar7 >> 8;
            sVar27 = 4;
          }
          host->buffers[0].dataLength = sVar27;
          uVar7 = peer->outgoingPeerID;
          if (uVar7 < 0xfff) {
            iVar17._0_1_ = peer->outgoingSessionID;
            iVar17._1_1_ = peer->incomingSessionID;
            iVar17._2_2_ = *(undefined2 *)&peer->field_0x22;
            uVar16 = uVar16 | (ushort)(iVar17 << 0xc);
            host->headerFlags = uVar16;
          }
          headerData._0_2_ = (uVar16 | uVar7) << 8 | (uVar16 | uVar7) >> 8;
          p_Var15 = host->checksumCallback;
          if (p_Var15 != (ENetChecksumCallback)0x0) {
            if (uVar7 < 0xfff) {
              uVar26 = (ulong)peer->connectID;
            }
            else {
              uVar26 = 0;
            }
            *(ulong *)(headerData + sVar27) = uVar26;
            host->buffers[0].dataLength = sVar27 + 8;
            uVar19 = (*p_Var15)(host->buffers,(int)host->bufferCount);
            *(uint64_t *)(headerData + sVar27) = uVar19;
          }
          peer->lastSendTime = host->serviceTime;
          uVar25 = enet_socket_send(host->socket,&peer->address,host->buffers,host->bufferCount);
          pEVar4 = &peer->sentUnreliableCommands;
          p_Var24 = (peer->sentUnreliableCommands).sentinel.next;
          if (p_Var24 != &pEVar4->sentinel) {
            do {
              p_Var13 = p_Var24->next;
              p_Var21 = p_Var24->previous;
              p_Var21->next = p_Var13;
              p_Var13->previous = p_Var21;
              packet = (ENetPacket *)p_Var24[5].previous;
              if (packet != (ENetPacket *)0x0) {
                puVar1 = &packet->referenceCount;
                *puVar1 = *puVar1 - 1;
                if (*puVar1 == 0) {
                  pbVar2 = (byte *)((long)&packet->flags + 1);
                  *pbVar2 = *pbVar2 | 1;
                  enet_packet_destroy(packet);
                }
              }
              (*(code *)callbacks_1)(p_Var24);
              p_Var24 = (pEVar4->sentinel).next;
            } while (p_Var24 != &pEVar4->sentinel);
            if (((peer->state == ENET_PEER_STATE_DISCONNECT_LATER) &&
                ((pEVar3->sentinel).next == &pEVar3->sentinel)) &&
               ((peer->sentReliableCommands).sentinel.next == &(peer->sentReliableCommands).sentinel
               )) {
              enet_peer_disconnect(peer,peer->eventData);
            }
          }
          if ((int)uVar25 < 0) {
            return -1;
          }
          peer->totalDataSent = peer->totalDataSent + (ulong)uVar25;
          uVar5 = host->totalSentData;
          uVar6 = host->totalSentPackets;
          host->totalSentData = uVar5 + uVar25;
          host->totalSentPackets = uVar6 + 1;
        }
      }
LAB_00103cd3:
      pEVar18 = host->peers;
    }
    iVar17 = host->continueSending;
  } while( true );
}

Assistant:

static int enet_protocol_send_outgoing_commands(ENetHost* host, ENetEvent* event, int checkForTimeouts) {
	uint8_t headerData[sizeof(ENetProtocolHeader) + sizeof(enet_checksum)];
	ENetProtocolHeader* header = (ENetProtocolHeader*)headerData;
	ENetPeer* currentPeer;
	int sentLength;
	host->continueSending = 1;

	while (host->continueSending) {
		for (host->continueSending = 0, currentPeer = host->peers; currentPeer < &host->peers[host->peerCount]; ++currentPeer) {
			if (currentPeer->state == ENET_PEER_STATE_DISCONNECTED || currentPeer->state == ENET_PEER_STATE_ZOMBIE)
				continue;

			host->headerFlags = 0;
			host->commandCount = 0;
			host->bufferCount = 1;
			host->packetSize = sizeof(ENetProtocolHeader);
			
			if (host->checksumCallback != NULL)
					host->packetSize += sizeof(enet_checksum);
				
			if (!enet_list_empty(&currentPeer->acknowledgements))
				enet_protocol_send_acknowledgements(host, currentPeer);

			if (checkForTimeouts != 0 && !enet_list_empty(&currentPeer->sentReliableCommands) && ENET_TIME_GREATER_EQUAL(host->serviceTime, currentPeer->nextTimeout) && enet_protocol_check_timeouts(host, currentPeer, event) == 1) {
				if (event != NULL && event->type != ENET_EVENT_TYPE_NONE)
					return 1;
				else
					continue;
			}

			if ((enet_list_empty(&currentPeer->outgoingCommands) || enet_protocol_check_outgoing_commands(host, currentPeer)) && enet_list_empty(&currentPeer->sentReliableCommands) && ENET_TIME_DIFFERENCE(host->serviceTime, currentPeer->lastReceiveTime) >= currentPeer->pingInterval && currentPeer->mtu - host->packetSize >= sizeof(ENetProtocolPing)) {
				enet_peer_ping(currentPeer);
				enet_protocol_check_outgoing_commands(host, currentPeer);
			}

			if (host->commandCount == 0)
				continue;

			host->buffers->data = headerData;

			if (host->headerFlags & ENET_PROTOCOL_HEADER_FLAG_SENT_TIME) {
				header->sentTime = ENET_HOST_TO_NET_16(host->serviceTime & 0xFFFF);
				host->buffers->dataLength = sizeof(ENetProtocolHeader);
			}
			else {
				host->buffers->dataLength = (size_t) & ((ENetProtocolHeader*)0)->sentTime;
			}

			if (currentPeer->outgoingPeerID < ENET_PROTOCOL_MAXIMUM_PEER_ID)
				host->headerFlags |= currentPeer->outgoingSessionID << ENET_PROTOCOL_HEADER_SESSION_SHIFT;

			header->peerID = ENET_HOST_TO_NET_16(currentPeer->outgoingPeerID | host->headerFlags);

			if (host->checksumCallback != NULL) {
				enet_checksum* checksum = (enet_checksum*)&headerData[host->buffers->dataLength];
				*checksum = currentPeer->outgoingPeerID < ENET_PROTOCOL_MAXIMUM_PEER_ID ? currentPeer->connectID : 0;
				host->buffers->dataLength += sizeof(enet_checksum);
				*checksum = host->checksumCallback(host->buffers, host->bufferCount);
			}

			currentPeer->lastSendTime = host->serviceTime;
			sentLength = enet_socket_send(host->socket, &currentPeer->address, host->buffers, host->bufferCount);

			enet_protocol_remove_sent_unreliable_commands(currentPeer);

			if (sentLength < 0)
				return -1;

			host->totalSentData += sentLength;
			currentPeer->totalDataSent += sentLength;
			host->totalSentPackets++;
		}
	}

	return 0;
}